

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O0

Bool FindLinkA(TidyDocImpl *doc,Node *node,ctmbstr url)

{
  Bool BVar1;
  AttVal *av;
  bool local_32;
  AttVal *href;
  Bool found;
  ctmbstr url_local;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  href._4_4_ = no;
  for (url_local = (ctmbstr)node->content; href._4_4_ == no && url_local != (ctmbstr)0x0;
      url_local = *(ctmbstr *)(url_local + 0x10)) {
    if (((url_local == (ctmbstr)0x0) || (*(long *)(url_local + 0x38) == 0)) ||
       (**(int **)(url_local + 0x38) != 1)) {
      href._4_4_ = FindLinkA(doc,(Node *)url_local,url);
    }
    else {
      av = prvTidyAttrGetById((Node *)url_local,TidyAttr_HREF);
      BVar1 = hasValue(av);
      local_32 = false;
      if (BVar1 != no) {
        BVar1 = urlMatch(url,av->value);
        local_32 = BVar1 != no;
      }
      href._4_4_ = (Bool)local_32;
    }
  }
  return href._4_4_;
}

Assistant:

static Bool FindLinkA( TidyDocImpl* doc, Node* node, ctmbstr url )
{
  Bool found = no;
  for ( node = node->content; !found && node; node = node->next )
  {
    if ( nodeIsA(node) )
    {
      AttVal* href = attrGetHREF( node );
      found = ( hasValue(href) && urlMatch(url, href->value) );
    }
    else
        found = FindLinkA( doc, node, url );
  }
  return found;
}